

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c219.c
# Opt level: O3

void c219_w(void *chip,UINT16 offset,UINT8 data)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  
  uVar3 = offset & 0x1ff;
  uVar1 = offset & 0x1f7;
  if ((offset & 1) == 0) {
    uVar1 = uVar3;
  }
  if (uVar3 < 0x1f8) {
    uVar1 = uVar3;
  }
  *(UINT8 *)((long)chip + (ulong)uVar1 + 0x20) = data;
  if ((uVar1 < 0x100) && ((uVar1 & 0xf) == 5)) {
    uVar3 = uVar1 >> 4;
    if ((char)data < '\0') {
      uVar2 = (ulong)(uVar1 & 0xf0);
      *(uint *)((long)chip + (ulong)uVar3 * 0x1c + 0x438) =
           (uint)*(byte *)((long)chip + uVar2 + 0x2a) * 0x200 +
           (uint)*(byte *)((long)chip + uVar2 + 0x2b) * 2;
      iVar4 = (uint)*(byte *)((long)chip + uVar2 + 0x26) * 0x200 +
              (uint)*(byte *)((long)chip + uVar2 + 0x27) * 2;
      *(int *)((long)chip + (ulong)uVar3 * 0x1c + 0x430) = iVar4;
      *(uint *)((long)chip + (ulong)uVar3 * 0x1c + 0x434) =
           (uint)*(byte *)((long)chip + uVar2 + 0x28) * 0x200 +
           (uint)*(byte *)((long)chip + uVar2 + 0x29) * 2;
      *(undefined1 *)((long)chip + (ulong)uVar3 * 0x1c + 0x43c) = 1;
      *(int *)((long)chip + (ulong)uVar3 * 0x1c + 0x424) = iVar4;
      *(undefined4 *)((long)chip + (ulong)uVar3 * 0x1c + 0x428) = 0xffff;
      *(undefined2 *)((long)chip + (ulong)uVar3 * 0x1c + 0x42c) = 0;
      return;
    }
    *(undefined1 *)((long)chip + (ulong)uVar3 * 0x1c + 0x43c) = 0;
  }
  return;
}

Assistant:

static void c219_w(void *chip, UINT16 offset, UINT8 data)
{
	c219_state *info = (c219_state *)chip;

	offset&=0x1ff;
	// mirror the bank registers on the 219, fixes bkrtmaq (and probably xday2 based on notes in the HLE)
	if (offset >= 0x1f8 && (offset & 0x001))
		offset &= ~0x008;

	info->REG[offset]=data;
	if (offset < 0x100)
	{
		C219_VOICE *v = &info->voi[offset>>4];

		if ((offset & 0xF) == 0x5)
		{
			if (data & C219_MODE_KEYON)
			{
				const C219_VREGS* vreg = (C219_VREGS*)&info->REG[offset & 0x1F0];

				// on the 219 asic, addresses are in words
				v->sample_loop = ((vreg->loop_msb<<8) | vreg->loop_lsb)*2;
				v->sample_start = ((vreg->start_msb<<8) | vreg->start_lsb)*2;
				v->sample_end = ((vreg->end_msb<<8) | vreg->end_lsb)*2;
				v->key=1;
				v->pos = v->sample_start;
				v->pofs = 0xFFFF;
				v->sample = 0;
				v->last_sample = 0;

				#if 0
				logerror("219: play v %d mode %02x start %x loop %x end %x\n",
					offset>>4, vreg->mode,
					find_sample(info, v->sample_start, v->bank, offset>>4),
					find_sample(info, v->sample_loop, v->bank, offset>>4),
					find_sample(info, v->sample_end, v->bank, offset>>4));
				#endif
			}
			else
			{
				v->key=0;
			}
		}
	}
}